

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_console.cpp
# Opt level: O2

void Cmd_clear(FCommandLine *argv,APlayerPawn *who,int key)

{
  C_FlushDisplay();
  if (conbuffer != (FConsoleBuffer *)0x0) {
    FConsoleBuffer::Clear(conbuffer);
    return;
  }
  return;
}

Assistant:

CCMD (clear)
{
	C_FlushDisplay ();
	ClearConsole ();
}